

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

bool_t ecHasOrderA(word *a,ec_o *ec,word *q,size_t m,void *stack)

{
  bool_t bVar1;
  word *b;
  size_t n;
  word *in_stack_00000038;
  
  bVar1 = ecMulA(in_stack_00000038,a,ec,q,m,stack);
  return (bool_t)((bVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

bool_t ecHasOrderA(const word a[], const ec_o* ec, const word q[], size_t m,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* b = (word*)stack;
	stack = b + ec->d * n;
	// q a == O?
	return !ecMulA(b, a, ec, q, m, stack);
}